

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySet.h
# Opt level: O2

void __thiscall
cmInstallRuntimeDependencySet::AddExecutable
          (cmInstallRuntimeDependencySet *this,cmInstallTargetGenerator *executable)

{
  pointer *__ptr;
  _Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false> local_28;
  _Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false> local_20;
  cmInstallTargetGenerator *local_18;
  
  local_18 = executable;
  std::make_unique<cmInstallRuntimeDependencySet::TargetItem,cmInstallTargetGenerator*&>
            ((cmInstallTargetGenerator **)&local_20);
  local_28._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (Item *)0x0;
  AddExecutable(this,(unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
                      *)&local_28);
  if (local_28._M_head_impl != (Item *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Item[1])();
  }
  local_28._M_head_impl = (Item *)0x0;
  if (local_20._M_head_impl != (Item *)0x0) {
    (*(local_20._M_head_impl)->_vptr_Item[1])();
  }
  return;
}

Assistant:

void AddExecutable(cmInstallTargetGenerator* executable)
  {
    this->AddExecutable(cm::make_unique<TargetItem>(executable));
  }